

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::SchemaFile::DiskSchemaFile> __thiscall
kj::
heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
          (kj *this,ReadableDirectory *params,Path *params_1,
          ArrayPtr<const_kj::ReadableDirectory_*const> *params_2,
          Own<const_kj::ReadableFile> *params_3,Maybe<kj::String> *params_4)

{
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath;
  DiskSchemaFile *this_00;
  DiskSchemaFile *extraout_RDX;
  Own<capnp::SchemaFile::DiskSchemaFile> OVar1;
  Own<const_kj::ReadableFile> local_78;
  Array<kj::String> local_68;
  NullableValue<kj::String> local_50;
  
  this_00 = (DiskSchemaFile *)operator_new(0x68);
  local_68.ptr = (params_1->parts).ptr;
  local_68.size_ = (params_1->parts).size_;
  local_68.disposer = (params_1->parts).disposer;
  (params_1->parts).ptr = (String *)0x0;
  (params_1->parts).size_ = 0;
  importPath = *params_2;
  local_78.disposer = params_3->disposer;
  local_78.ptr = params_3->ptr;
  params_3->ptr = (ReadableFile *)0x0;
  local_50.isSet = (params_4->ptr).isSet;
  if (local_50.isSet == true) {
    local_50.field_1.value.content.ptr = (params_4->ptr).field_1.value.content.ptr;
    local_50.field_1.value.content.size_ = (params_4->ptr).field_1.value.content.size_;
    local_50.field_1.value.content.disposer = (params_4->ptr).field_1.value.content.disposer;
    (params_4->ptr).field_1.value.content.ptr = (char *)0x0;
    (params_4->ptr).field_1.value.content.size_ = 0;
  }
  capnp::SchemaFile::DiskSchemaFile::DiskSchemaFile
            (this_00,params,(Path *)&local_68,importPath,&local_78,(Maybe<kj::String> *)&local_50);
  *(undefined8 **)this = &_::HeapDisposer<capnp::SchemaFile::DiskSchemaFile>::instance;
  *(DiskSchemaFile **)(this + 8) = this_00;
  _::NullableValue<kj::String>::~NullableValue(&local_50);
  Own<const_kj::ReadableFile>::dispose(&local_78);
  Array<kj::String>::~Array(&local_68);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}